

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest.hpp
# Opt level: O2

void __thiscall iutest::UnitTestSource::SetUpDefaultXmlListener(UnitTestSource *this)

{
  bool bVar1;
  ostream *poVar2;
  Variable *pVVar3;
  Variable *pVVar4;
  undefined1 auStack_198 [400];
  
  bVar1 = TestEnv::is_output_option_dirty();
  if (bVar1) {
    bVar1 = TestEnv::has_output_option();
    if (!bVar1) {
      pVVar3 = TestEnv::get_vars();
      pVVar4 = TestEnv::get_vars();
      TestEventListeners::Release
                (&pVVar3->m_event_listeners,(pVVar4->m_event_listeners).m_default_xml_generator);
      return;
    }
    TestEnv::flush_output_option();
    bVar1 = DefaultXmlGeneratorListener::SetUp();
    if (!bVar1) {
      bVar1 = JunitXmlGeneratorListener::SetUp();
      if (!bVar1) {
        detail::IUTestLog::IUTestLog
                  ((IUTestLog *)auStack_198,LOG_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest.hpp"
                   ,0x7b0);
        poVar2 = std::operator<<((ostream *)(auStack_198 + 0x18),"unrecognized output format \"");
        pVVar3 = TestEnv::get_vars();
        poVar2 = std::operator<<(poVar2,(string *)&(pVVar3->m_output_option).m_value);
        std::operator<<(poVar2,"\" ignored.");
        detail::IUTestLog::~IUTestLog((IUTestLog *)auStack_198);
      }
    }
  }
  return;
}

Assistant:

void SetUpDefaultXmlListener()
    {
        if( TestEnv::is_output_option_dirty() )
        {
            if( TestEnv::has_output_option() )
            {
                TestEnv::flush_output_option();

                do
                {
#if defined(__WANDBOX__)
                    if( StderrXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
                    if( StderrJunitXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
#else
                    if( DefaultXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
                    if( JunitXmlGeneratorListener::SetUp() )
                    {
                        break;
                    }
#endif
                    IUTEST_LOG_(WARNING) << "unrecognized output format \"" << TestEnv::get_output_option() << "\" ignored.";
                } while( detail::AlwaysFalse() );
            }
            else
            {
                TestEnv::event_listeners().Release(TestEnv::event_listeners().default_xml_generator());
            }
        }
    }